

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scorer.cc
# Opt level: O0

void multipredict<&expf>(scorer *param_1,single_learner *base,example *ec,size_t count,
                        size_t param_5,polyprediction *pred,bool finalize_predictions)

{
  size_t in_RCX;
  example *in_RDX;
  learner<char,_example> *in_RSI;
  size_t in_R8;
  polyprediction *in_R9;
  float fVar1;
  size_t c;
  ulong local_40;
  
  LEARNER::learner<char,_example>::multipredict
            (in_RSI,in_RDX,in_RCX,in_R8,in_R9,(bool)((byte)c & 1));
  for (local_40 = 0; local_40 < in_RCX; local_40 = local_40 + 1) {
    fVar1 = expf(in_R9[local_40].scalar);
    in_R9[local_40].scalar = fVar1;
  }
  return;
}

Assistant:

inline void multipredict(scorer&, LEARNER::single_learner& base, example& ec, size_t count, size_t,
    polyprediction* pred, bool finalize_predictions)
{
  base.multipredict(ec, 0, count, pred, finalize_predictions);  // TODO: need to thread step through???
  for (size_t c = 0; c < count; c++) pred[c].scalar = link(pred[c].scalar);
}